

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::java::ImmutableMapFieldLiteGenerator::GenerateMembers
          (ImmutableMapFieldLiteGenerator *this,Printer *printer)

{
  FieldDescriptor *pFVar1;
  Printer *pPVar2;
  Printer *pPVar3;
  string_view end_varname;
  string_view end_varname_00;
  string_view end_varname_01;
  string_view end_varname_02;
  string_view end_varname_03;
  string_view end_varname_04;
  string_view end_varname_05;
  string_view end_varname_06;
  string_view end_varname_07;
  string_view end_varname_08;
  string_view end_varname_09;
  string_view end_varname_10;
  string_view end_varname_11;
  string_view end_varname_12;
  bool bVar4;
  JavaType JVar5;
  flat_hash_map<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *vars;
  Options *pOVar6;
  undefined1 uVar7;
  string_view local_820;
  undefined1 local_810 [80];
  string_view local_7c0;
  undefined1 local_7b0 [80];
  string_view local_760;
  FieldDescriptor local_750;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_6f8;
  basic_string_view<char,_std::char_traits<char>_> local_6f0;
  string_view local_6e0;
  string_view local_6d0;
  FieldDescriptor local_6c0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_668;
  basic_string_view<char,_std::char_traits<char>_> local_660;
  string_view local_650;
  string_view local_640;
  FieldDescriptor local_630;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_5d8;
  basic_string_view<char,_std::char_traits<char>_> local_5d0;
  string_view local_5c0;
  string_view local_5b0;
  FieldDescriptor local_5a0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_548;
  basic_string_view<char,_std::char_traits<char>_> local_540;
  string_view local_530;
  string_view local_520;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_508;
  basic_string_view<char,_std::char_traits<char>_> local_500;
  string_view local_4f0;
  string_view local_4e0;
  FieldDescriptor local_4d0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_478;
  basic_string_view<char,_std::char_traits<char>_> local_470;
  string_view local_460;
  string_view local_450;
  FieldDescriptor local_440;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_3e8;
  basic_string_view<char,_std::char_traits<char>_> local_3e0;
  string_view local_3d0;
  string_view local_3c0;
  FieldDescriptor local_3b0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_358;
  basic_string_view<char,_std::char_traits<char>_> local_350;
  string_view local_340;
  string_view local_330;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_318;
  basic_string_view<char,_std::char_traits<char>_> local_310;
  string_view local_300;
  string_view local_2f0;
  FieldDescriptor local_2e0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_288;
  basic_string_view<char,_std::char_traits<char>_> local_280;
  string_view local_270;
  string_view local_260;
  FieldDescriptor local_250;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_1f8;
  basic_string_view<char,_std::char_traits<char>_> local_1f0;
  string_view local_1e0;
  string_view local_1d0;
  FieldDescriptor local_1c0;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_168;
  basic_string_view<char,_std::char_traits<char>_> local_160;
  string_view local_150;
  string_view local_140;
  string_view local_130;
  FieldDescriptor *local_120;
  FieldDescriptor *value;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_110;
  basic_string_view<char,_std::char_traits<char>_> local_108;
  string_view local_f8;
  string_view local_e8 [2];
  FieldDescriptor local_c8;
  optional<google::protobuf::io::AnnotationCollector::Semantic> local_70;
  basic_string_view<char,_std::char_traits<char>_> local_68;
  string_view local_58;
  string_view local_48;
  string_view local_38;
  string_view local_28;
  Printer *local_18;
  Printer *printer_local;
  ImmutableMapFieldLiteGenerator *this_local;
  
  vars = &this->variables_;
  local_18 = printer;
  printer_local = (Printer *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_28,
             "private static final class $capitalized_name$DefaultEntryHolder {\n  static final com.google.protobuf.MapEntryLite<\n      $type_parameters$> defaultEntry =\n          com.google.protobuf.MapEntryLite\n          .<$type_parameters$>newDefaultInstance(\n              $key_wire_type$,\n              $key_default_value$,\n              $value_wire_type$,\n              $value_default_value$);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (printer,vars,local_28);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_38,
             "private com.google.protobuf.MapFieldLite<\n    $type_parameters$> $name$_ =\n        com.google.protobuf.MapFieldLite.emptyMapField();\nprivate com.google.protobuf.MapFieldLite<$type_parameters$>\ninternalGet$capitalized_name$() {\n  return $name$_;\n}\nprivate com.google.protobuf.MapFieldLite<$type_parameters$>\ninternalGetMutable$capitalized_name$() {\n  if (!$name$_.isMutable()) {\n    $name$_ = $name$_.mutableCopy();\n  }\n  return $name$_;\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,vars,local_38);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_48,
             "@java.lang.Override\n$deprecation$\npublic int ${$get$capitalized_name$Count$}$() {\n  return internalGet$capitalized_name$().size();\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,vars,local_48);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_68,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_70);
  end_varname_12._M_str = local_68._M_str;
  end_varname_12._M_len = local_68._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_58,end_varname_12,pFVar1,local_70);
  pPVar3 = local_18;
  uVar7 = SUB81(local_68._M_str,0);
  pPVar2 = (Printer *)this->descriptor_;
  pOVar6 = Context::options(this->context_);
  Options::Options((Options *)&local_c8,pOVar6);
  WriteFieldDocComment((java *)pPVar3,pPVar2,&local_c8,(Options *)0x0,(bool)uVar7);
  Options::~Options((Options *)&local_c8);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (local_e8,
             "@java.lang.Override\n$deprecation$\npublic boolean ${$contains$capitalized_name$$}$(\n    $key_type$ key) {\n  $key_null_check$\n  return internalGet$capitalized_name$().containsKey(key);\n}\n"
            );
  protobuf::io::Printer::
  Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
            (pPVar2,&this->variables_,local_e8[0]);
  pPVar2 = local_18;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_f8,"{");
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_108,"}");
  pFVar1 = this->descriptor_;
  std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_110);
  end_varname_11._M_str = local_108._M_str;
  end_varname_11._M_len = local_108._M_len;
  protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
            (pPVar2,local_f8,end_varname_11,pFVar1,local_110);
  uVar7 = SUB81(local_108._M_str,0);
  local_120 = MapValueField(this->descriptor_);
  JVar5 = GetJavaType(local_120);
  pPVar2 = local_18;
  if (JVar5 == JAVATYPE_ENUM) {
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_130,
               "private static final\ncom.google.protobuf.Internal.MapAdapter.Converter<\n    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n            $value_enum_type$.internalGetValueMap(),\n            $unrecognized_value$);\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_130);
    pOVar6 = Context::options(this->context_);
    pPVar2 = local_18;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_140,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_140);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_150,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_160,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_168);
      end_varname_10._M_str = local_160._M_str;
      end_varname_10._M_len = local_160._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_150,end_varname_10,pFVar1,local_168);
      uVar7 = SUB81(local_160._M_str,0);
    }
    pPVar3 = local_18;
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_1c0,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_1c0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_1c0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_1d0,
               "@java.lang.Override\n$deprecation$\npublic java.util.Map<$boxed_key_type$, $value_enum_type$>\n${$get$capitalized_name$Map$}$() {\n  return java.util.Collections.unmodifiableMap(\n      new com.google.protobuf.Internal.MapAdapter<\n        $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n            internalGet$capitalized_name$(),\n            $name$ValueConverter));\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_1d0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1e0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1f0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_1f8);
    end_varname_09._M_str = local_1f0._M_str;
    end_varname_09._M_len = local_1f0._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_1e0,end_varname_09,pFVar1,local_1f8);
    pPVar3 = local_18;
    uVar7 = SUB81(local_1f0._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_250,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_250,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_250);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_260,
               "@java.lang.Override\n$deprecation$\npublic $value_enum_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_enum_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key)\n         ? $name$ValueConverter.doForward(map.get(key))\n         : defaultValue;\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_260);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_270,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_280,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_288);
    end_varname_08._M_str = local_280._M_str;
    end_varname_08._M_len = local_280._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_270,end_varname_08,pFVar1,local_288);
    pPVar3 = local_18;
    uVar7 = SUB81(local_280._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_2e0,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_2e0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_2e0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2f0,
               "@java.lang.Override\n$deprecation$\npublic $value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return $name$ValueConverter.doForward(map.get(key));\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_2f0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_300,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_310,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_318);
    end_varname_07._M_str = local_310._M_str;
    end_varname_07._M_len = local_310._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_300,end_varname_07,pFVar1,local_318);
    uVar7 = SUB81(local_310._M_str,0);
    bVar4 = SupportUnknownEnumValue(local_120);
    pPVar2 = local_18;
    if (bVar4) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_330,
                 "/**\n * Use {@link #get$capitalized_name$ValueMap()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$Value$}$() {\n  return get$capitalized_name$ValueMap();\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_330);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_340,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_350,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_358);
      end_varname_06._M_str = local_350._M_str;
      end_varname_06._M_len = local_350._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_340,end_varname_06,pFVar1,local_358);
      pPVar3 = local_18;
      uVar7 = SUB81(local_350._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_3b0,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_3b0,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_3b0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3c0,
                 "@java.lang.Override\n$deprecation$\npublic java.util.Map<$boxed_key_type$, $boxed_value_type$>\n${$get$capitalized_name$ValueMap$}$() {\n  return java.util.Collections.unmodifiableMap(\n      internalGet$capitalized_name$());\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_3c0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3d0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_3e0,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_3e8);
      end_varname_05._M_str = local_3e0._M_str;
      end_varname_05._M_len = local_3e0._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_3d0,end_varname_05,pFVar1,local_3e8);
      pPVar3 = local_18;
      uVar7 = SUB81(local_3e0._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_440,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_440,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_440);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_450,
                 "@java.lang.Override\n$deprecation$\npublic $value_type_pass_through_nullness$ ${$get$capitalized_name$ValueOrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_450);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_460,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_470,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_478);
      end_varname_04._M_str = local_470._M_str;
      end_varname_04._M_len = local_470._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_460,end_varname_04,pFVar1,local_478);
      pPVar3 = local_18;
      uVar7 = SUB81(local_470._M_str,0);
      pPVar2 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)&local_4d0,pOVar6);
      WriteFieldDocComment((java *)pPVar3,pPVar2,&local_4d0,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)&local_4d0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_4e0,
                 "@java.lang.Override\n$deprecation$\npublic $value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_4e0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_4f0,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_500,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_508);
      end_varname_03._M_str = local_500._M_str;
      end_varname_03._M_len = local_500._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_4f0,end_varname_03,pFVar1,local_508);
      uVar7 = SUB81(local_500._M_str,0);
    }
  }
  else {
    pOVar6 = Context::options(this->context_);
    pPVar2 = local_18;
    if ((pOVar6->opensource_runtime & 1U) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_520,
                 "/**\n * Use {@link #get$capitalized_name$Map()} instead.\n */\n@java.lang.Override\n@java.lang.Deprecated\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$$}$() {\n  return get$capitalized_name$Map();\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_520);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_530,"{");
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_540,"}");
      pFVar1 = this->descriptor_;
      std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_548);
      end_varname_02._M_str = local_540._M_str;
      end_varname_02._M_len = local_540._M_len;
      protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (pPVar2,local_530,end_varname_02,pFVar1,local_548);
      uVar7 = SUB81(local_540._M_str,0);
    }
    pPVar3 = local_18;
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_5a0,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_5a0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_5a0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_5b0,
               "@java.lang.Override\n$deprecation$\npublic java.util.Map<$type_parameters$> ${$get$capitalized_name$Map$}$() {\n  return java.util.Collections.unmodifiableMap(\n      internalGet$capitalized_name$());\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_5b0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5c0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_5d0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_5d8);
    end_varname_01._M_str = local_5d0._M_str;
    end_varname_01._M_len = local_5d0._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_5c0,end_varname_01,pFVar1,local_5d8);
    pPVar3 = local_18;
    uVar7 = SUB81(local_5d0._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_630,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_630,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_630);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_640,
               "@java.lang.Override\n$deprecation$\npublic $value_type_pass_through_nullness$ ${$get$capitalized_name$OrDefault$}$(\n    $key_type$ key,\n    $value_type_pass_through_nullness$ defaultValue) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$();\n  return map.containsKey(key) ? map.get(key) : defaultValue;\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_640);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_650,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_660,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_668);
    end_varname_00._M_str = local_660._M_str;
    end_varname_00._M_len = local_660._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_650,end_varname_00,pFVar1,local_668);
    pPVar3 = local_18;
    uVar7 = SUB81(local_660._M_str,0);
    pPVar2 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_6c0,pOVar6);
    WriteFieldDocComment((java *)pPVar3,pPVar2,&local_6c0,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_6c0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_6d0,
               "@java.lang.Override\n$deprecation$\npublic $value_type$ ${$get$capitalized_name$OrThrow$}$(\n    $key_type$ key) {\n  $key_null_check$\n  java.util.Map<$type_parameters$> map =\n      internalGet$capitalized_name$();\n  if (!map.containsKey(key)) {\n    throw new java.lang.IllegalArgumentException();\n  }\n  return map.get(key);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_6d0);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6e0,"{");
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_6f0,"}");
    pFVar1 = this->descriptor_;
    std::optional<google::protobuf::io::AnnotationCollector::Semantic>::optional(&local_6f8);
    end_varname._M_str = local_6f0._M_str;
    end_varname._M_len = local_6f0._M_len;
    protobuf::io::Printer::Annotate<google::protobuf::FieldDescriptor>
              (pPVar2,local_6e0,end_varname,pFVar1,local_6f8);
    uVar7 = SUB81(local_6f0._M_str,0);
  }
  JVar5 = GetJavaType(local_120);
  pPVar2 = local_18;
  if (JVar5 == JAVATYPE_ENUM) {
    pPVar3 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)&local_750,pOVar6);
    WriteFieldDocComment((java *)pPVar2,pPVar3,&local_750,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)&local_750);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_760,
               "private java.util.Map<$boxed_key_type$, $value_enum_type$>\ngetMutable$capitalized_name$Map() {\n  return new com.google.protobuf.Internal.MapAdapter<\n      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n          internalGetMutable$capitalized_name$(),\n          $name$ValueConverter);\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_760);
    bVar4 = SupportUnknownEnumValue(local_120);
    pPVar2 = local_18;
    if (bVar4) {
      pPVar3 = (Printer *)this->descriptor_;
      pOVar6 = Context::options(this->context_);
      Options::Options((Options *)local_7b0,pOVar6);
      WriteFieldDocComment
                ((java *)pPVar2,pPVar3,(FieldDescriptor *)local_7b0,(Options *)0x0,(bool)uVar7);
      Options::~Options((Options *)local_7b0);
      pPVar2 = local_18;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_7c0,
                 "private java.util.Map<$boxed_key_type$, $boxed_value_type$>\ngetMutable$capitalized_name$ValueMap() {\n  return internalGetMutable$capitalized_name$();\n}\n"
                );
      protobuf::io::Printer::
      Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
                (pPVar2,&this->variables_,local_7c0);
    }
  }
  else {
    pPVar3 = (Printer *)this->descriptor_;
    pOVar6 = Context::options(this->context_);
    Options::Options((Options *)local_810,pOVar6);
    WriteFieldDocComment
              ((java *)pPVar2,pPVar3,(FieldDescriptor *)local_810,(Options *)0x0,(bool)uVar7);
    Options::~Options((Options *)local_810);
    pPVar2 = local_18;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_820,
               "private java.util.Map<$type_parameters$>\ngetMutable$capitalized_name$Map() {\n  return internalGetMutable$capitalized_name$();\n}\n"
              );
    protobuf::io::Printer::
    Print<absl::lts_20250127::flat_hash_map<std::basic_string_view<char,std::char_traits<char>>,std::__cxx11::string,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::__cxx11::string>>>>
              (pPVar2,&this->variables_,local_820);
  }
  return;
}

Assistant:

void ImmutableMapFieldLiteGenerator::GenerateMembers(
    io::Printer* printer) const {
  printer->Print(
      variables_,
      "private static final class $capitalized_name$DefaultEntryHolder {\n"
      "  static final com.google.protobuf.MapEntryLite<\n"
      "      $type_parameters$> defaultEntry =\n"
      "          com.google.protobuf.MapEntryLite\n"
      "          .<$type_parameters$>newDefaultInstance(\n"
      "              $key_wire_type$,\n"
      "              $key_default_value$,\n"
      "              $value_wire_type$,\n"
      "              $value_default_value$);\n"
      "}\n");
  printer->Print(variables_,
                 "private com.google.protobuf.MapFieldLite<\n"
                 "    $type_parameters$> $name$_ =\n"
                 "        com.google.protobuf.MapFieldLite.emptyMapField();\n"
                 "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
                 "internalGet$capitalized_name$() {\n"
                 "  return $name$_;\n"
                 "}\n"
                 "private com.google.protobuf.MapFieldLite<$type_parameters$>\n"
                 "internalGetMutable$capitalized_name$() {\n"
                 "  if (!$name$_.isMutable()) {\n"
                 "    $name$_ = $name$_.mutableCopy();\n"
                 "  }\n"
                 "  return $name$_;\n"
                 "}\n");
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$\n"
                 "public int ${$get$capitalized_name$Count$}$() {\n"
                 "  return internalGet$capitalized_name$().size();\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);
  WriteFieldDocComment(printer, descriptor_, context_->options());
  printer->Print(variables_,
                 "@java.lang.Override\n"
                 "$deprecation$\n"
                 "public boolean ${$contains$capitalized_name$$}$(\n"
                 "    $key_type$ key) {\n"
                 "  $key_null_check$\n"
                 "  return internalGet$capitalized_name$().containsKey(key);\n"
                 "}\n");
  printer->Annotate("{", "}", descriptor_);

  const FieldDescriptor* value = MapValueField(descriptor_);
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    printer->Print(
        variables_,
        "private static final\n"
        "com.google.protobuf.Internal.MapAdapter.Converter<\n"
        "    java.lang.Integer, $value_enum_type$> $name$ValueConverter =\n"
        "        com.google.protobuf.Internal.MapAdapter.newEnumConverter(\n"
        "            $value_enum_type$.internalGetValueMap(),\n"
        "            $unrecognized_value$);\n");
    if (context_->options().opensource_runtime) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$Map()} instead.\n"
          " */\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
          "${$get$capitalized_name$$}$() {\n"
          "  return get$capitalized_name$Map();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "${$get$capitalized_name$Map$}$() {\n"
        "  return java.util.Collections.unmodifiableMap(\n"
        "      new com.google.protobuf.Internal.MapAdapter<\n"
        "        $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "            internalGet$capitalized_name$(),\n"
        "            $name$ValueConverter));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_enum_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_enum_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key)\n"
        "         ? $name$ValueConverter.doForward(map.get(key))\n"
        "         : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_enum_type$ ${$get$capitalized_name$OrThrow$}$(\n"
        "    $key_type$ key) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  if (!map.containsKey(key)) {\n"
        "    throw new java.lang.IllegalArgumentException();\n"
        "  }\n"
        "  return $name$ValueConverter.doForward(map.get(key));\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    if (SupportUnknownEnumValue(value)) {
      printer->Print(
          variables_,
          "/**\n"
          " * Use {@link #get$capitalized_name$ValueMap()} instead.\n"
          " */\n"
          "@java.lang.Override\n"
          "@java.lang.Deprecated\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$Value$}$() {\n"
          "  return get$capitalized_name$ValueMap();\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "${$get$capitalized_name$ValueMap$}$() {\n"
          "  return java.util.Collections.unmodifiableMap(\n"
          "      internalGet$capitalized_name$());\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public $value_type_pass_through_nullness$ "
          "${$get$capitalized_name$ValueOrDefault$}$(\n"
          "    $key_type$ key,\n"
          "    $value_type_pass_through_nullness$ defaultValue) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "@java.lang.Override\n"
          "$deprecation$\n"
          "public $value_type$ ${$get$capitalized_name$ValueOrThrow$}$(\n"
          "    $key_type$ key) {\n"
          "  $key_null_check$\n"
          "  java.util.Map<$boxed_key_type$, $boxed_value_type$> map =\n"
          "      internalGet$capitalized_name$();\n"
          "  if (!map.containsKey(key)) {\n"
          "    throw new java.lang.IllegalArgumentException();\n"
          "  }\n"
          "  return map.get(key);\n"
          "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
  } else {
    if (context_->options().opensource_runtime) {
      printer->Print(variables_,
                     "/**\n"
                     " * Use {@link #get$capitalized_name$Map()} instead.\n"
                     " */\n"
                     "@java.lang.Override\n"
                     "@java.lang.Deprecated\n"
                     "public java.util.Map<$type_parameters$> "
                     "${$get$capitalized_name$$}$() {\n"
                     "  return get$capitalized_name$Map();\n"
                     "}\n");
      printer->Annotate("{", "}", descriptor_);
    }
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$\n"
                   "public java.util.Map<$type_parameters$> "
                   "${$get$capitalized_name$Map$}$() {\n"
                   "  return java.util.Collections.unmodifiableMap(\n"
                   "      internalGet$capitalized_name$());\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "@java.lang.Override\n"
        "$deprecation$\n"
        "public $value_type_pass_through_nullness$ "
        "${$get$capitalized_name$OrDefault$}$(\n"
        "    $key_type$ key,\n"
        "    $value_type_pass_through_nullness$ defaultValue) {\n"
        "  $key_null_check$\n"
        "  java.util.Map<$type_parameters$> map =\n"
        "      internalGet$capitalized_name$();\n"
        "  return map.containsKey(key) ? map.get(key) : defaultValue;\n"
        "}\n");
    printer->Annotate("{", "}", descriptor_);
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "@java.lang.Override\n"
                   "$deprecation$\n"
                   "public $value_type$ ${$get$capitalized_name$OrThrow$}$(\n"
                   "    $key_type$ key) {\n"
                   "  $key_null_check$\n"
                   "  java.util.Map<$type_parameters$> map =\n"
                   "      internalGet$capitalized_name$();\n"
                   "  if (!map.containsKey(key)) {\n"
                   "    throw new java.lang.IllegalArgumentException();\n"
                   "  }\n"
                   "  return map.get(key);\n"
                   "}\n");
    printer->Annotate("{", "}", descriptor_);
  }

  // Generate private setters for the builder to proxy into.
  if (GetJavaType(value) == JAVATYPE_ENUM) {
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(
        variables_,
        "private java.util.Map<$boxed_key_type$, $value_enum_type$>\n"
        "getMutable$capitalized_name$Map() {\n"
        "  return new com.google.protobuf.Internal.MapAdapter<\n"
        "      $boxed_key_type$, $value_enum_type$, java.lang.Integer>(\n"
        "          internalGetMutable$capitalized_name$(),\n"
        "          $name$ValueConverter);\n"
        "}\n");
    if (SupportUnknownEnumValue(value)) {
      WriteFieldDocComment(printer, descriptor_, context_->options());
      printer->Print(
          variables_,
          "private java.util.Map<$boxed_key_type$, $boxed_value_type$>\n"
          "getMutable$capitalized_name$ValueMap() {\n"
          "  return internalGetMutable$capitalized_name$();\n"
          "}\n");
    }
  } else {
    WriteFieldDocComment(printer, descriptor_, context_->options());
    printer->Print(variables_,
                   "private java.util.Map<$type_parameters$>\n"
                   "getMutable$capitalized_name$Map() {\n"
                   "  return internalGetMutable$capitalized_name$();\n"
                   "}\n");
  }
}